

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

Aig_Man_t *
Aig_ManRegCreatePart
          (Aig_Man_t *pAig,Vec_Int_t *vPart,int *pnCountPis,int *pnCountRegs,int **ppMapBack)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Aig_Obj_t **ppNodes;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar4;
  Aig_Man_t *p_01;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int *__s;
  void *pvVar6;
  int *pMapBack;
  int local_68;
  int nCountRegs;
  int nCountPis;
  int i;
  int iOut;
  int nOffset;
  Vec_Ptr_t *vRoots;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int **ppMapBack_local;
  int *pnCountRegs_local;
  int *pnCountPis_local;
  Vec_Int_t *vPart_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Vec_IntSize(vPart);
  p = Vec_PtrAlloc(iVar1);
  iVar1 = Aig_ManCoNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (nCountRegs = 0; iVar3 = Vec_IntSize(vPart), nCountRegs < iVar3; nCountRegs = nCountRegs + 1)
  {
    iVar3 = Vec_IntEntry(vPart,nCountRegs);
    pAVar4 = Aig_ManCo(pAig,(iVar1 - iVar2) + iVar3);
    pAVar4 = Aig_ObjFanin0(pAVar4);
    Vec_PtrPush(p,pAVar4);
  }
  ppNodes = (Aig_Obj_t **)Vec_PtrArray(p);
  iVar1 = Vec_PtrSize(p);
  p_00 = Aig_ManDfsNodes(pAig,ppNodes,iVar1);
  Vec_PtrFree(p);
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (nCountRegs = 0; iVar3 = Vec_IntSize(vPart), nCountRegs < iVar3; nCountRegs = nCountRegs + 1)
  {
    iVar3 = Vec_IntEntry(vPart,nCountRegs);
    pAVar4 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar3);
    Aig_ObjSetTravIdPrevious(pAig,pAVar4);
  }
  pMapBack._4_4_ = 0;
  local_68 = 0;
  nCountRegs = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(pAig);
    iVar2 = Aig_ManRegNum(pAig);
    if (iVar1 - iVar2 <= nCountRegs) break;
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,nCountRegs);
    iVar1 = Aig_ObjIsTravIdCurrent(pAig,pAVar4);
    local_68 = iVar1 + local_68;
    nCountRegs = nCountRegs + 1;
  }
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (nCountRegs = iVar1 - iVar2; iVar1 = Vec_PtrSize(pAig->vCis), nCountRegs < iVar1;
      nCountRegs = nCountRegs + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,nCountRegs);
    iVar1 = Aig_ObjIsTravIdCurrent(pAig,pAVar4);
    pMapBack._4_4_ = iVar1 + pMapBack._4_4_;
  }
  if (pnCountPis != (int *)0x0) {
    *pnCountPis = local_68;
  }
  if (pnCountRegs != (int *)0x0) {
    *pnCountRegs = pMapBack._4_4_;
  }
  iVar1 = Vec_PtrSize(p_00);
  p_01 = Aig_ManStart(iVar1);
  pAVar4 = Aig_ManConst1(p_01);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pAVar4;
  for (nCountRegs = 0; iVar1 = Vec_PtrSize(pAig->vCis), nCountRegs < iVar1;
      nCountRegs = nCountRegs + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,nCountRegs);
    iVar1 = Aig_ObjIsTravIdCurrent(pAig,pAVar4);
    if (iVar1 != 0) {
      pAVar5 = Aig_ObjCreateCi(p_01);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  iVar1 = Aig_ManCiNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (nCountRegs = 0; iVar3 = Vec_IntSize(vPart), nCountRegs < iVar3; nCountRegs = nCountRegs + 1)
  {
    iVar3 = Vec_IntEntry(vPart,nCountRegs);
    pAVar4 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar3);
    pAVar5 = Aig_ObjCreateCi(p_01);
    (pAVar4->field_5).pData = pAVar5;
    Aig_ObjCreateCo(p_01,(Aig_Obj_t *)(pAVar4->field_5).pData);
    Aig_ObjSetTravIdCurrent(pAig,pAVar4);
  }
  for (nCountRegs = 0; iVar1 = Vec_PtrSize(p_00), nCountRegs < iVar1; nCountRegs = nCountRegs + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,nCountRegs);
    iVar1 = Aig_ObjIsNode(pAVar4);
    if (iVar1 != 0) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_01,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  iVar1 = Aig_ManCoNum(pAig);
  iVar2 = Aig_ManRegNum(pAig);
  for (nCountRegs = 0; iVar3 = Vec_IntSize(vPart), nCountRegs < iVar3; nCountRegs = nCountRegs + 1)
  {
    iVar3 = Vec_IntEntry(vPart,nCountRegs);
    pAVar4 = Aig_ManCo(pAig,(iVar1 - iVar2) + iVar3);
    pAVar4 = Aig_ObjChild0Copy(pAVar4);
    Aig_ObjCreateCo(p_01,pAVar4);
  }
  iVar1 = Vec_IntSize(vPart);
  p_01->nRegs = iVar1;
  if (ppMapBack != (int **)0x0) {
    iVar1 = Aig_ManObjNumMax(p_01);
    __s = (int *)malloc((long)iVar1 << 2);
    iVar1 = Aig_ManObjNumMax(p_01);
    memset(__s,0xff,(long)iVar1 << 2);
    *__s = 0;
    for (nCountRegs = 0; iVar1 = Vec_PtrSize(p_00), nCountRegs < iVar1; nCountRegs = nCountRegs + 1)
    {
      pvVar6 = Vec_PtrEntry(p_00,nCountRegs);
      pAVar4 = Aig_Regular(*(Aig_Obj_t **)((long)pvVar6 + 0x28));
      __s[pAVar4->Id] = *(int *)((long)pvVar6 + 0x24);
    }
    iVar1 = Aig_ManCiNum(pAig);
    iVar2 = Aig_ManRegNum(pAig);
    for (nCountRegs = 0; iVar3 = Vec_IntSize(vPart), nCountRegs < iVar3; nCountRegs = nCountRegs + 1
        ) {
      iVar3 = Vec_IntEntry(vPart,nCountRegs);
      pAVar4 = Aig_ManCi(pAig,(iVar1 - iVar2) + iVar3);
      __s[*(int *)((long)(pAVar4->field_5).pData + 0x24)] = pAVar4->Id;
    }
    *ppMapBack = __s;
  }
  Vec_PtrFree(p_00);
  return p_01;
}

Assistant:

Aig_Man_t * Aig_ManRegCreatePart( Aig_Man_t * pAig, Vec_Int_t * vPart, int * pnCountPis, int * pnCountRegs, int ** ppMapBack )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vRoots;
    int nOffset, iOut, i;
    int nCountPis, nCountRegs;
    int * pMapBack;
    // collect roots
    vRoots = Vec_PtrAlloc( Vec_IntSize(vPart) );
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo(pAig, nOffset+iOut);
        Vec_PtrPush( vRoots, Aig_ObjFanin0(pObj) );
    }
    // collect/mark nodes/PIs in the DFS order
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );
    Vec_PtrFree( vRoots );
    // unmark register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        Aig_ObjSetTravIdPrevious( pAig, pObj );
    }
    // count pure PIs
    nCountPis = nCountRegs = 0;
    Aig_ManForEachPiSeq( pAig, pObj, i )
        nCountPis += Aig_ObjIsTravIdCurrent(pAig, pObj);
    // count outputs of other registers
    Aig_ManForEachLoSeq( pAig, pObj, i )
        nCountRegs += Aig_ObjIsTravIdCurrent(pAig, pObj); 
    if ( pnCountPis )
        *pnCountPis = nCountPis;
    if ( pnCountRegs )
        *pnCountRegs = nCountRegs;
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pNew);
    // create the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    // add variables for the register outputs
    // create fake POs to hold the register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
        Aig_ObjSetTravIdCurrent( pAig, pObj ); // added
    }
    // create the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And(pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add real POs for the registers
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo( pAig, nOffset+iOut );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    pNew->nRegs = Vec_IntSize(vPart);
    // create map
    if ( ppMapBack )
    {
        pMapBack = ABC_ALLOC( int, Aig_ManObjNumMax(pNew) );
        memset( pMapBack, 0xff, sizeof(int) * Aig_ManObjNumMax(pNew) );
        // map constant nodes
        pMapBack[0] = 0;
        // logic cones of register outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Aig_Regular((Aig_Obj_t *)pObj->pData);
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        // map register outputs
        nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
        Vec_IntForEachEntry( vPart, iOut, i )
        {
            pObj = Aig_ManCi(pAig, nOffset+iOut);
            pObjNew = (Aig_Obj_t *)pObj->pData;
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        *ppMapBack = pMapBack;
    }
    Vec_PtrFree( vNodes );
    return pNew;
}